

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O2

void Qentem::Memory::Sort<false,unsigned_int,unsigned_int>(uint *arr,uint start,uint end)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  while (start != end) {
    uVar3 = (ulong)start;
    uVar1 = start;
    while( true ) {
      uVar1 = uVar1 + 1;
      uVar2 = (uint)uVar3;
      if (end <= uVar1) break;
      if (arr[start] < arr[uVar1]) {
        uVar3 = (ulong)(uVar2 + 1);
        uVar2 = arr[uVar3];
        arr[uVar3] = arr[uVar1];
        arr[uVar1] = uVar2;
      }
    }
    if (uVar2 != start) {
      uVar1 = arr[uVar3];
      arr[uVar3] = arr[start];
      arr[start] = uVar1;
    }
    Sort<false,unsigned_int,unsigned_int>(arr,start,uVar2);
    start = uVar2 + 1;
  }
  return;
}

Assistant:

inline static void Sort(Type_T *arr, Number_T start, Number_T end) noexcept {
    if (start != end) {
        Type_T  &item   = arr[start];
        Number_T index  = start;
        Number_T offset = (start + Number_T{1});

        while (offset < end) {
            if (Ascend_T) {
                if (arr[offset] < item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            } else {
                if (arr[offset] > item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            }

            ++offset;
        }

        if (index != start) {
            Swap(arr[index], arr[start]);
        }

        Sort<Ascend_T>(arr, start, index);
        ++index;
        Sort<Ascend_T>(arr, index, end);
    }
}